

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_grzip.c
# Opt level: O3

int archive_write_grzip_options(archive_write_filter *f,char *key,char *value)

{
  return -0x14;
}

Assistant:

static int
archive_write_grzip_options(struct archive_write_filter *f, const char *key,
    const char *value)
{
	(void)f; /* UNUSED */
	(void)key; /* UNUSED */
	(void)value; /* UNUSED */
	/* Note: The "warn" return is just to inform the options
	 * supervisor that we didn't handle it.  It will generate
	 * a suitable error if no one used this option. */
	return (ARCHIVE_WARN);
}